

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O1

void __thiscall
network::Network::receiver
          (Network *this,
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *callback)

{
  _func_int ***ppp_Var1;
  execution_context eVar2;
  size_t sVar3;
  service *psVar4;
  io_service service;
  endpoint sender_ep;
  socket sock;
  char buf [1024];
  io_context local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  mutable_buffers_1 local_4b8;
  data_union local_4a8;
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  local_488;
  data_union local_438 [36];
  
  boost::asio::io_context::io_context(&local_4e8);
  local_438[0]._8_4_ = 0;
  local_438[0]._12_4_ = 0;
  local_438[0]._16_4_ = 0;
  local_438[0]._20_8_ = 0;
  local_438[0]._2_2_ = this->port_ << 8 | this->port_ >> 8;
  local_438[0]._0_2_ = 2;
  local_438[0]._4_4_ = 0;
  boost::asio::
  basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_socket<boost::asio::io_context>
            ((basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)&local_488,&local_4e8,(endpoint_type *)&local_438[0].base,(type *)0x0);
  while( true ) {
    local_4a8._8_4_ = 0;
    local_4a8._12_4_ = 0;
    local_4a8._16_4_ = 0;
    local_4a8._20_8_ = 0;
    local_4a8._0_8_ = 2;
    memset(local_438,0,0x400);
    local_4b8.super_mutable_buffer.size_ = 0x400;
    local_4b8.super_mutable_buffer.data_ = local_438;
    boost::asio::
    basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::receive_from<boost::asio::mutable_buffers_1>
              ((basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)&local_488,&local_4b8,(endpoint_type *)&local_4a8.base);
    if (this->isReceiverRun == false) {
      boost::asio::detail::
      io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::~io_object_impl(&local_488);
      for (psVar4 = (local_4e8.super_execution_context.service_registry_)->first_service_;
          eVar2.service_registry_ = local_4e8.super_execution_context.service_registry_,
          psVar4 != (service *)0x0; psVar4 = psVar4->next_) {
        (*psVar4->_vptr_service[2])(psVar4);
      }
      psVar4 = (local_4e8.super_execution_context.service_registry_)->first_service_;
      while (psVar4 != (service *)0x0) {
        ppp_Var1 = &psVar4->_vptr_service;
        psVar4 = psVar4->next_;
        (*(*ppp_Var1)[1])();
        (eVar2.service_registry_)->first_service_ = psVar4;
      }
      if (local_4e8.super_execution_context.service_registry_ != (service_registry *)0x0) {
        pthread_mutex_destroy
                  ((pthread_mutex_t *)&(local_4e8.super_execution_context.service_registry_)->mutex_
                  );
        operator_delete(local_4e8.super_execution_context.service_registry_,0x40);
      }
      return;
    }
    local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
    sVar3 = strlen((char *)local_438);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4d8,local_438,(long)local_438 + sVar3);
    if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) break;
    (*callback->_M_invoker)((_Any_data *)callback,&local_4d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
      operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

void Network::receiver(const std::function<void(std::string)> callback)
{
	boost::asio::io_service service;
	udp::socket sock(service, udp::endpoint(udp::v4(), port_));
	char buf[PACKAGE_SIZE];
	while (true)
	{
		try
		{
			udp::endpoint sender_ep;
			memset(buf, 0, PACKAGE_SIZE);

			sock.receive_from(boost::asio::buffer(buf, PACKAGE_SIZE), sender_ep);

			if (!isReceiverRun)
				return;

			callback(buf);
		}
		catch (...)
		{
			continue;
		}
	}
}